

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void mask_morph(Mat *mask)

{
  undefined1 local_2c0 [32];
  Point_<int> local_2a0;
  _InputArray local_298;
  _OutputArray local_280;
  _InputArray local_268;
  undefined1 local_250 [32];
  Point_<int> local_230;
  _InputArray local_228;
  _OutputArray local_210;
  _InputArray local_1f8;
  undefined1 local_1e0 [32];
  Point_<int> local_1c0;
  _InputArray local_1b8;
  _OutputArray local_1a0;
  _InputArray local_188;
  undefined1 local_170 [32];
  Point_<int> local_150;
  _InputArray local_148;
  _OutputArray local_130;
  _InputArray local_118;
  Point_<int> local_fc [2];
  Size_<int> local_e8;
  Mat local_e0 [8];
  Mat dilateElement;
  Point_<int> local_80;
  Size_<int> local_78;
  Mat local_70 [8];
  Mat erodeElement;
  Mat *mask_local;
  
  cv::Size_<int>::Size_(&local_78,3,3);
  cv::Point_<int>::Point_(&local_80,-1,-1);
  cv::getStructuringElement(local_70,0,&local_78,&local_80);
  cv::Size_<int>::Size_(&local_e8,8,8);
  cv::Point_<int>::Point_(local_fc,-1,-1);
  cv::getStructuringElement(local_e0,0,&local_e8,local_fc);
  cv::_InputArray::_InputArray(&local_118,mask);
  cv::_OutputArray::_OutputArray(&local_130,mask);
  cv::_InputArray::_InputArray(&local_148,local_70);
  cv::Point_<int>::Point_(&local_150,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::erode(&local_118,&local_130,&local_148,&local_150,1,0,local_170);
  cv::_InputArray::~_InputArray(&local_148);
  cv::_OutputArray::~_OutputArray(&local_130);
  cv::_InputArray::~_InputArray(&local_118);
  cv::_InputArray::_InputArray(&local_188,mask);
  cv::_OutputArray::_OutputArray(&local_1a0,mask);
  cv::_InputArray::_InputArray(&local_1b8,local_70);
  cv::Point_<int>::Point_(&local_1c0,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::erode(&local_188,&local_1a0,&local_1b8,&local_1c0,1,0,local_1e0);
  cv::_InputArray::~_InputArray(&local_1b8);
  cv::_OutputArray::~_OutputArray(&local_1a0);
  cv::_InputArray::~_InputArray(&local_188);
  cv::_InputArray::_InputArray(&local_1f8,mask);
  cv::_OutputArray::_OutputArray(&local_210,mask);
  cv::_InputArray::_InputArray(&local_228,local_e0);
  cv::Point_<int>::Point_(&local_230,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_1f8,&local_210,&local_228,&local_230,1,0,local_250);
  cv::_InputArray::~_InputArray(&local_228);
  cv::_OutputArray::~_OutputArray(&local_210);
  cv::_InputArray::~_InputArray(&local_1f8);
  cv::_InputArray::_InputArray(&local_268,mask);
  cv::_OutputArray::_OutputArray(&local_280,mask);
  cv::_InputArray::_InputArray(&local_298,local_e0);
  cv::Point_<int>::Point_(&local_2a0,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_268,&local_280,&local_298,&local_2a0,1,0,local_2c0);
  cv::_InputArray::~_InputArray(&local_298);
  cv::_OutputArray::~_OutputArray(&local_280);
  cv::_InputArray::~_InputArray(&local_268);
  cv::Mat::~Mat(local_e0);
  cv::Mat::~Mat(local_70);
  return;
}

Assistant:

void mask_morph(Mat &mask) {
    Mat erodeElement = getStructuringElement(MORPH_RECT, Size(3, 3));
    Mat dilateElement = getStructuringElement(MORPH_RECT, Size(8, 8));
    erode(mask, mask, erodeElement);
    erode(mask, mask, erodeElement);
    dilate(mask, mask, dilateElement);
    dilate(mask, mask, dilateElement);
}